

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::unit_from_string(string *unit_string,uint64_t match_flags)

{
  precise_unit pVar1;
  string local_48;
  ulong local_28;
  uint64_t match_flags_local;
  string *unit_string_local;
  undefined8 local_10;
  
  local_28 = match_flags & 0xffffffefffffffff;
  match_flags_local = (uint64_t)unit_string;
  std::__cxx11::string::string((string *)&local_48,(string *)unit_string);
  pVar1 = unit_from_string_internal(&local_48,local_28);
  local_10 = pVar1._8_8_;
  unit_string_local = (string *)pVar1.multiplier_;
  std::__cxx11::string::~string((string *)&local_48);
  pVar1.base_units_ = (unit_data)(undefined4)local_10;
  pVar1.commodity_ = local_10._4_4_;
  pVar1.multiplier_ = (double)unit_string_local;
  return pVar1;
}

Assistant:

precise_unit
    unit_from_string(std::string unit_string, std::uint64_t match_flags)
{
    // always allow the code replacements on first run
    match_flags &= (~skip_code_replacements);
    return unit_from_string_internal(std::move(unit_string), match_flags);
}